

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsx-impl.inc.c
# Opt level: O1

void gen_xvxsigdp(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *s;
  TCGTemp *ts;
  TCGTemp *ts_00;
  TCGTemp *ts_01;
  TCGTemp *ts_02;
  TCGTemp *ts_03;
  TCGTemp *ts_04;
  TCGv_i64 c2;
  TCGv_i64 c2_00;
  TCGv_i64 c1;
  uintptr_t o_1;
  uintptr_t o;
  TCGv_i64 ret;
  
  if (ctx->vsx_enabled != false) {
    s = ctx->uc->tcg_ctx;
    ts = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
    ts_00 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
    ts_01 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
    ts_02 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
    tcg_gen_op3_ppc64(s,INDEX_op_ld_i64,(TCGArg)ts_01,(TCGArg)(s->cpu_env + (long)s),
                      (ulong)((ctx->opcode >> 0xb & 0x1f | (ctx->opcode & 2) << 4) * 0x10 + 0x12b28)
                     );
    tcg_gen_op3_ppc64(s,INDEX_op_ld_i64,(TCGArg)ts_02,(TCGArg)(s->cpu_env + (long)s),
                      (ulong)((ctx->opcode >> 0xb & 0x1f | (ctx->opcode & 2) << 4) * 0x10 + 0x12b20)
                     );
    ts_03 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
    c1 = (TCGv_i64)((long)ts_03 - (long)s);
    ts_04 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
    ret = (TCGv_i64)((long)ts_04 - (long)s);
    c2 = tcg_const_i64_ppc64(s,0);
    c2_00 = tcg_const_i64_ppc64(s,0x7ff);
    tcg_gen_extract_i64_ppc64(s,c1,(TCGv_i64)((long)ts_01 - (long)s),0x34,0xb);
    tcg_gen_op2_ppc64(s,INDEX_op_movi_i64,(TCGArg)ts_04,0x10000000000000);
    tcg_gen_movcond_i64_ppc64(s,TCG_COND_EQ,ret,c1,c2,c2,ret);
    tcg_gen_movcond_i64_ppc64(s,TCG_COND_EQ,ret,c1,c2_00,c2,ret);
    tcg_gen_deposit_i64_ppc64
              (s,(TCGv_i64)((long)ts - (long)s),ret,(TCGv_i64)((long)ts_01 - (long)s),0,0x34);
    tcg_gen_op3_ppc64(s,INDEX_op_st_i64,(TCGArg)ts,(TCGArg)(s->cpu_env + (long)s),
                      (ulong)((ctx->opcode >> 0x15 & 0x1f | (ctx->opcode & 1) << 5) * 0x10 + 0x12b28
                             ));
    tcg_gen_extract_i64_ppc64(s,c1,(TCGv_i64)((long)ts_02 - (long)s),0x34,0xb);
    tcg_gen_op2_ppc64(s,INDEX_op_movi_i64,(TCGArg)ts_04,0x10000000000000);
    tcg_gen_movcond_i64_ppc64(s,TCG_COND_EQ,ret,c1,c2,c2,ret);
    tcg_gen_movcond_i64_ppc64(s,TCG_COND_EQ,ret,c1,c2_00,c2,ret);
    tcg_gen_deposit_i64_ppc64
              (s,(TCGv_i64)((long)ts_00 - (long)s),ret,(TCGv_i64)((long)ts_02 - (long)s),0,0x34);
    tcg_gen_op3_ppc64(s,INDEX_op_st_i64,(TCGArg)ts_00,(TCGArg)(s->cpu_env + (long)s),
                      (ulong)((ctx->opcode >> 0x15 & 0x1f | (ctx->opcode & 1) << 5) * 0x10 + 0x12b20
                             ));
    tcg_temp_free_internal_ppc64(s,ts_04);
    tcg_temp_free_internal_ppc64(s,ts_03);
    tcg_temp_free_internal_ppc64(s,(TCGTemp *)(c2 + (long)s));
    tcg_temp_free_internal_ppc64(s,(TCGTemp *)(c2_00 + (long)s));
    tcg_temp_free_internal_ppc64(s,ts);
    tcg_temp_free_internal_ppc64(s,ts_00);
    tcg_temp_free_internal_ppc64(s,ts_01);
    tcg_temp_free_internal_ppc64(s,ts_02);
    return;
  }
  gen_exception(ctx,0x5e);
  return;
}

Assistant:

static void gen_xvxsigdp(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i64 xth;
    TCGv_i64 xtl;
    TCGv_i64 xbh;
    TCGv_i64 xbl;
    TCGv_i64 t0, zr, nan, exp;

    if (unlikely(!ctx->vsx_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_VSXU);
        return;
    }
    xth = tcg_temp_new_i64(tcg_ctx);
    xtl = tcg_temp_new_i64(tcg_ctx);
    xbh = tcg_temp_new_i64(tcg_ctx);
    xbl = tcg_temp_new_i64(tcg_ctx);
    get_cpu_vsrh(tcg_ctx, xbh, xB(ctx->opcode));
    get_cpu_vsrl(tcg_ctx, xbl, xB(ctx->opcode));
    exp = tcg_temp_new_i64(tcg_ctx);
    t0 = tcg_temp_new_i64(tcg_ctx);
    zr = tcg_const_i64(tcg_ctx, 0);
    nan = tcg_const_i64(tcg_ctx, 2047);

    tcg_gen_extract_i64(tcg_ctx, exp, xbh, 52, 11);
    tcg_gen_movi_i64(tcg_ctx, t0, 0x0010000000000000);
    tcg_gen_movcond_i64(tcg_ctx, TCG_COND_EQ, t0, exp, zr, zr, t0);
    tcg_gen_movcond_i64(tcg_ctx, TCG_COND_EQ, t0, exp, nan, zr, t0);
    tcg_gen_deposit_i64(tcg_ctx, xth, t0, xbh, 0, 52);
    set_cpu_vsrh(tcg_ctx, xT(ctx->opcode), xth);

    tcg_gen_extract_i64(tcg_ctx, exp, xbl, 52, 11);
    tcg_gen_movi_i64(tcg_ctx, t0, 0x0010000000000000);
    tcg_gen_movcond_i64(tcg_ctx, TCG_COND_EQ, t0, exp, zr, zr, t0);
    tcg_gen_movcond_i64(tcg_ctx, TCG_COND_EQ, t0, exp, nan, zr, t0);
    tcg_gen_deposit_i64(tcg_ctx, xtl, t0, xbl, 0, 52);
    set_cpu_vsrl(tcg_ctx, xT(ctx->opcode), xtl);

    tcg_temp_free_i64(tcg_ctx, t0);
    tcg_temp_free_i64(tcg_ctx, exp);
    tcg_temp_free_i64(tcg_ctx, zr);
    tcg_temp_free_i64(tcg_ctx, nan);
    tcg_temp_free_i64(tcg_ctx, xth);
    tcg_temp_free_i64(tcg_ctx, xtl);
    tcg_temp_free_i64(tcg_ctx, xbh);
    tcg_temp_free_i64(tcg_ctx, xbl);
}